

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_wstring_equal_integer(void)

{
  undefined1 local_709;
  basic_variable<std::allocator<char>_> local_708;
  basic_variable<std::allocator<char>_> local_6d8;
  undefined1 local_69b [2];
  undefined1 local_699;
  basic_variable<std::allocator<char>_> local_698;
  basic_variable<std::allocator<char>_> local_668;
  undefined1 local_62b [2];
  undefined1 local_629;
  basic_variable<std::allocator<char>_> local_628;
  basic_variable<std::allocator<char>_> local_5f8;
  undefined1 local_5bb [2];
  undefined1 local_5b9;
  basic_variable<std::allocator<char>_> local_5b8;
  basic_variable<std::allocator<char>_> local_588;
  undefined1 local_54b [2];
  undefined1 local_549;
  basic_variable<std::allocator<char>_> local_548;
  basic_variable<std::allocator<char>_> local_518;
  undefined1 local_4db [2];
  undefined1 local_4d9;
  basic_variable<std::allocator<char>_> local_4d8;
  basic_variable<std::allocator<char>_> local_4a8;
  undefined1 local_46b [2];
  undefined1 local_469;
  basic_variable<std::allocator<char>_> local_468;
  basic_variable<std::allocator<char>_> local_438;
  undefined1 local_3fb [2];
  undefined1 local_3f9;
  basic_variable<std::allocator<char>_> local_3f8;
  basic_variable<std::allocator<char>_> local_3c8;
  undefined1 local_392 [2];
  undefined4 local_390;
  undefined1 local_389;
  uint big_1;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_e [2];
  undefined4 local_c;
  int big;
  
  local_c = 0x7fffffff;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_48,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_78,0);
  local_e[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == variable(0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x888,"void equality_suite::compare_wstring_equal_integer()",local_e,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_b8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_e8,0);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != variable(0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x889,"void equality_suite::compare_wstring_equal_integer()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_128,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_158,0x7fffffff);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x88a,"void equality_suite::compare_wstring_equal_integer()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_198,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_1c8,0x7fffffff);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x88b,"void equality_suite::compare_wstring_equal_integer()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_208,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_238,0);
  local_1cb[0] = trial::dynamic::operator==(&local_208,&local_238);
  local_239 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(0)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x88d,"void equality_suite::compare_wstring_equal_integer()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_278,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2a8,0);
  local_23b[0] = trial::dynamic::operator!=(&local_278,&local_2a8);
  local_2a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(0)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x88e,"void equality_suite::compare_wstring_equal_integer()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_2e8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_318,0x7fffffff);
  local_2ab[0] = trial::dynamic::operator==(&local_2e8,&local_318);
  local_319 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x88f,"void equality_suite::compare_wstring_equal_integer()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_358,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)&big_1,0x7fffffff);
  local_31b[0] = trial::dynamic::operator!=
                           (&local_358,(basic_variable<std::allocator<char>_> *)&big_1);
  local_389 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x890,"void equality_suite::compare_wstring_equal_integer()",local_31b,&local_389);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)&big_1);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  local_390 = 0xffffffff;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_3c8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_3f8,0);
  local_392[0] = trial::dynamic::operator==(&local_3c8,&local_3f8);
  local_3f9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == variable(0U)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x896,"void equality_suite::compare_wstring_equal_integer()",local_392,&local_3f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_438,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_468,0);
  local_3fb[0] = trial::dynamic::operator!=(&local_438,&local_468);
  local_469 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != variable(0U)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x897,"void equality_suite::compare_wstring_equal_integer()",local_3fb,&local_469);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_468);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_438);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_4a8,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_4d8,0xffffffff);
  local_46b[0] = trial::dynamic::operator==(&local_4a8,&local_4d8);
  local_4d9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x898,"void equality_suite::compare_wstring_equal_integer()",local_46b,&local_4d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_518,L"");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_548,0xffffffff);
  local_4db[0] = trial::dynamic::operator!=(&local_518,&local_548);
  local_549 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x899,"void equality_suite::compare_wstring_equal_integer()",local_4db,&local_549);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_548);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_518);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_588,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_5b8,0);
  local_54b[0] = trial::dynamic::operator==(&local_588,&local_5b8);
  local_5b9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(0U)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x89b,"void equality_suite::compare_wstring_equal_integer()",local_54b,&local_5b9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_588);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_5f8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_628,0);
  local_5bb[0] = trial::dynamic::operator!=(&local_5f8,&local_628);
  local_629 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(0U)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x89c,"void equality_suite::compare_wstring_equal_integer()",local_5bb,&local_629);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_628);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_668,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_698,0xffffffff);
  local_62b[0] = trial::dynamic::operator==(&local_668,&local_698);
  local_699 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") == variable(big)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x89d,"void equality_suite::compare_wstring_equal_integer()",local_62b,&local_699);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_698);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_668);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(&local_6d8,L"bravo");
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            (&local_708,0xffffffff);
  local_69b[0] = trial::dynamic::operator!=(&local_6d8,&local_708);
  local_709 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(L\"bravo\") != variable(big)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x89e,"void equality_suite::compare_wstring_equal_integer()",local_69b,&local_709);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_708);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6d8);
  return;
}

Assistant:

void compare_wstring_equal_integer()
{
    // wstring - signed
    {
        const auto big = std::numeric_limits<signed int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == variable(0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != variable(0), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(0), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(0), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(big), true);
    }
    // wstring - unsigned
    {
        const auto big = std::numeric_limits<unsigned int>::max();

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == variable(0U), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != variable(0U), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"") != variable(big), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(0U), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(0U), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") == variable(big), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(L"bravo") != variable(big), true);
    }
}